

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForExtension
          (FileGenerator *this,int idx,Printer *printer)

{
  reference this_00;
  pointer this_01;
  Options *in_RCX;
  string local_a8;
  undefined1 local_88 [8];
  NamespaceOpener ns;
  undefined1 local_58 [8];
  Formatter format;
  Printer *printer_local;
  int idx_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_58,printer,&this->variables_);
  GenerateSourceIncludes
            (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Namespace_abi_cxx11_(&local_a8,(cpp *)this->file_,(FileDescriptor *)&this->options_,in_RCX);
  NamespaceOpener::NamespaceOpener((NamespaceOpener *)local_88,&local_a8,(Formatter *)local_58);
  std::__cxx11::string::~string((string *)&local_a8);
  this_00 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
            ::operator[](&this->extension_generators_,(long)idx);
  this_01 = std::
            unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
            ::operator->(this_00);
  ExtensionGenerator::GenerateDefinition
            (this_01,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_88);
  Formatter::~Formatter((Formatter *)local_58);
  return;
}

Assistant:

void FileGenerator::GenerateSourceForExtension(int idx, io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);
  NamespaceOpener ns(Namespace(file_, options_), format);
  extension_generators_[idx]->GenerateDefinition(printer);
}